

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_lz4.c
# Opt level: O0

void test_option_lz4(void)

{
  wchar_t wVar1;
  char *pcVar2;
  ulong local_20;
  size_t s;
  char *pcStack_10;
  int r;
  char *p;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lz4.c"
                      ,L'\x10',"f",L'Ƥ',L'\xffffffff',"a");
  s._4_4_ = systemf("echo f | %s -o --lz4 >archive.out 2>archive.err",testprog);
  pcStack_10 = slurpfile(&local_20,"archive.err");
  pcStack_10[local_20] = '\0';
  if (s._4_4_ == L'\0') {
    free(pcStack_10);
    pcStack_10 = slurpfile(&local_20,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lz4.c"
                     ,L'B',(uint)(2 < local_20),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lz4.c"
                        ,L'C',pcStack_10,"p","\x04\"M\x18","\"\\x04\\x22\\x4d\\x18\"",4,"4",
                        (void *)0x0);
    free(pcStack_10);
  }
  else {
    pcVar2 = strstr(pcStack_10,"compression not available");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(pcStack_10,"Can\'t launch");
      if ((pcVar2 != (char *)0x0) && (wVar1 = canLz4(), wVar1 == L'\0')) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lz4.c"
                       ,L'#');
        test_skipping(
                     "This version of bsdcpio uses an external lz4 program but no such program is available on this system."
                     );
        free(pcStack_10);
        return;
      }
      pcVar2 = strstr(pcStack_10,"Can\'t write");
      if ((pcVar2 != (char *)0x0) && (wVar1 = canLz4(), wVar1 == L'\0')) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lz4.c"
                       ,L'-');
        test_skipping(
                     "This version of bsdcpio uses an external lz4 program but no such program is available on this system."
                     );
        free(pcStack_10);
        return;
      }
      pcVar2 = strstr(pcStack_10,"Error closing");
      if ((pcVar2 != (char *)0x0) && (wVar1 = canLz4(), wVar1 == L'\0')) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lz4.c"
                       ,L'5');
        test_skipping(
                     "This version of bsdcpio uses an external lz4 program but no such program is available on this system."
                     );
        free(pcStack_10);
        return;
      }
      failure("--lz4 option is broken: %s",pcStack_10);
      free(pcStack_10);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lz4.c"
                          ,L'<',(long)s._4_4_,"r",0,"0",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_lz4.c"
                     ,L'\x19');
      test_skipping("This version of bsdcpio was compiled without lz4 support");
      free(pcStack_10);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_lz4)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with lz4 compression. */
	r = systemf("echo f | %s -o --lz4 >archive.out 2>archive.err",
	    testprog);
	p = slurpfile(&s, "archive.err");
	p[s] = '\0';
	if (r != 0) {
		if (strstr(p, "compression not available") != NULL) {
			skipping("This version of bsdcpio was compiled "
			    "without lz4 support");
			free(p);
			return;
		}
		/* POSIX permits different handling of the spawnp
		 * system call used to launch the subsidiary
		 * program: */
		/* Some systems fail immediately to spawn the new process. */
		if (strstr(p, "Can't launch") != NULL && !canLz4()) {
			skipping("This version of bsdcpio uses an external lz4 program "
			    "but no such program is available on this system.");
			free(p);
			return;
		}
		/* Some systems successfully spawn the new process,
		 * but fail to exec a program within that process.
		 * This results in failure at the first attempt to
		 * write. */
		if (strstr(p, "Can't write") != NULL && !canLz4()) {
			skipping("This version of bsdcpio uses an external lz4 program "
			    "but no such program is available on this system.");
			free(p);
			return;
		}
		/* On some systems the error won't be detected until closing
		   time, by a 127 exit error returned by waitpid. */
		if (strstr(p, "Error closing") != NULL && !canLz4()) {
			skipping("This version of bsdcpio uses an external lz4 program "
			    "but no such program is available on this system.");
			free(p);
			return;
		}
		failure("--lz4 option is broken: %s", p);
		free(p);
		assertEqualInt(r, 0);
		return;
	}
	free(p);
	/* Check that the archive file has an lz4 signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "\x04\x22\x4d\x18", 4);
	free(p);
}